

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_bubble_sort(int64_t *dst,size_t size)

{
  long lVar1;
  size_t i;
  size_t sVar2;
  size_t n;
  size_t sVar3;
  int64_t _sort_swap_temp;
  
  while (sVar3 = size, sVar3 != 0) {
    size = 0;
    for (sVar2 = 1; sVar3 != sVar2; sVar2 = sVar2 + 1) {
      lVar1 = dst[sVar2 - 1];
      if (dst[sVar2] < lVar1) {
        dst[sVar2 - 1] = dst[sVar2];
        dst[sVar2] = lVar1;
        size = sVar2;
      }
    }
  }
  return;
}

Assistant:

void BUBBLE_SORT(SORT_TYPE *dst, const size_t size) {
  size_t n = size;

  while (n) {
    size_t i, newn = 0U;

    for (i = 1U; i < n; ++i) {
      if (SORT_CMP(dst[i - 1U], dst[i]) > 0) {
        SORT_SWAP(dst[i - 1U], dst[i]);
        newn = i;
      }
    }

    n = newn;
  }
}